

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void slang::ast::DefParamSymbol::fromSyntax
               (Scope *scope,DefParamSyntax *syntax,
               SmallVectorBase<const_slang::ast::DefParamSymbol_*> *results)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  DefParamAssignmentSyntax *this;
  DefParamSymbol *this_00;
  const_iterator __begin2;
  DefParamSymbol *sym;
  iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*> local_68;
  ulong local_58;
  Compilation *local_50;
  Token local_48;
  SourceLocation local_38;
  
  local_50 = scope->compilation;
  local_68.index = 0;
  local_58 = (syntax->assignments).elements._M_extent._M_extent_value + 1 >> 1;
  local_68.list = &syntax->assignments;
  for (; (local_68.list != &syntax->assignments || (local_68.index != local_58));
      local_68.index = local_68.index + 1) {
    this = slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::
           iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>::dereference(&local_68);
    local_48 = slang::syntax::SyntaxNode::getFirstToken(&this->super_SyntaxNode);
    local_38 = parsing::Token::location(&local_48);
    this_00 = BumpAllocator::emplace<slang::ast::DefParamSymbol,slang::SourceLocation>
                        (&local_50->super_BumpAllocator,&local_38);
    local_48._0_8_ = this_00;
    (this_00->super_Symbol).originatingSyntax = &this->super_SyntaxNode;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
    SmallVectorBase<slang::ast::DefParamSymbol_const*>::
    emplace_back<slang::ast::DefParamSymbol_const*const&>
              ((SmallVectorBase<slang::ast::DefParamSymbol_const*> *)results,
               (DefParamSymbol **)&local_48);
  }
  return;
}

Assistant:

void DefParamSymbol::fromSyntax(const Scope& scope, const DefParamSyntax& syntax,
                                SmallVectorBase<const DefParamSymbol*>& results) {
    auto& comp = scope.getCompilation();
    for (auto assignment : syntax.assignments) {
        auto sym = comp.emplace<DefParamSymbol>(assignment->getFirstToken().location());
        sym->setSyntax(*assignment);
        sym->setAttributes(scope, syntax.attributes);
        results.push_back(sym);
    }
}